

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_bswap16x8(TCGContext_conflict10 *tcg_ctx,TCGv_i64 outh,TCGv_i64 outl,TCGv_i64 inh,
                  TCGv_i64 inl)

{
  TCGv_i64 arg2;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  arg2 = tcg_const_i64_ppc64(tcg_ctx,0xff00ff00ff00ff);
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_and_i64_ppc64(tcg_ctx,ret,inh,arg2);
  tcg_gen_shli_i64_ppc64(tcg_ctx,ret,ret,8);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,inh,8);
  tcg_gen_and_i64_ppc64(tcg_ctx,ret_00,ret_00,arg2);
  tcg_gen_or_i64_ppc64(tcg_ctx,outh,ret,ret_00);
  tcg_gen_and_i64_ppc64(tcg_ctx,ret,inl,arg2);
  tcg_gen_shli_i64_ppc64(tcg_ctx,ret,ret,8);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,inl,8);
  tcg_gen_and_i64_ppc64(tcg_ctx,ret_00,ret_00,arg2);
  tcg_gen_or_i64_ppc64(tcg_ctx,outl,ret,ret_00);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_bswap16x8(TCGContext *tcg_ctx, TCGv_i64 outh, TCGv_i64 outl,
                          TCGv_i64 inh, TCGv_i64 inl)
{
    TCGv_i64 mask = tcg_const_i64(tcg_ctx, 0x00FF00FF00FF00FF);
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    /* outh = ((inh & mask) << 8) | ((inh >> 8) & mask) */
    tcg_gen_and_i64(tcg_ctx, t0, inh, mask);
    tcg_gen_shli_i64(tcg_ctx, t0, t0, 8);
    tcg_gen_shri_i64(tcg_ctx, t1, inh, 8);
    tcg_gen_and_i64(tcg_ctx, t1, t1, mask);
    tcg_gen_or_i64(tcg_ctx, outh, t0, t1);

    /* outl = ((inl & mask) << 8) | ((inl >> 8) & mask) */
    tcg_gen_and_i64(tcg_ctx, t0, inl, mask);
    tcg_gen_shli_i64(tcg_ctx, t0, t0, 8);
    tcg_gen_shri_i64(tcg_ctx, t1, inl, 8);
    tcg_gen_and_i64(tcg_ctx, t1, t1, mask);
    tcg_gen_or_i64(tcg_ctx, outl, t0, t1);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, mask);
}